

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealBox.H
# Opt level: O0

bool __thiscall amrex::RealBox::ok(RealBox *this)

{
  RealBox *in_RDI;
  Real RVar1;
  undefined1 local_9;
  
  RVar1 = length(in_RDI,0);
  local_9 = false;
  if (0.0 <= RVar1) {
    RVar1 = length(in_RDI,1);
    local_9 = false;
    if (0.0 <= RVar1) {
      RVar1 = length(in_RDI,2);
      local_9 = 0.0 <= RVar1;
    }
  }
  return local_9;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool ok () const noexcept {
        return (length(0) >= 0.0)
#if (AMREX_SPACEDIM > 1)
            && (length(1) >= 0.0)
#endif
#if (AMREX_SPACEDIM > 2)
            && (length(2) >= 0.0)
#endif
            ;
    }